

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printProblemStats.cpp
# Opt level: O1

string * toEnotation_abi_cxx11_(string *__return_storage_ptr__,LIndex nr)

{
  undefined8 uVar1;
  ostream *unaff_R12;
  stringstream ssE;
  stringstream ss;
  char local_371;
  ostream *local_370;
  ulong local_368;
  long local_360 [2];
  ostream local_350;
  undefined7 uStack_34f;
  ulong local_348;
  long local_340 [2];
  long *local_330;
  ulong local_328;
  long local_320 [14];
  ios_base local_2b0 [264];
  stringstream local_1a8 [16];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_198);
  std::__cxx11::stringbuf::str();
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  if (local_328 < 4) {
    std::__cxx11::stringbuf::str();
LAB_00102b05:
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_330);
  std::__cxx11::stringbuf::str();
  if (local_368 == 0) {
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
  }
  else {
    local_350 = *local_370;
    unaff_R12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(char *)&local_350,1);
    std::__ostream_insert<char,std::char_traits<char>>(unaff_R12,".",1);
    std::__cxx11::stringbuf::str();
    if (1 < local_348) {
      local_371 = *(char *)(CONCAT71(uStack_34f,local_350) + 1);
      std::__ostream_insert<char,std::char_traits<char>>(unaff_R12,&local_371,1);
      if ((long *)CONCAT71(uStack_34f,local_350) != local_340) {
        operator_delete((long *)CONCAT71(uStack_34f,local_350),local_340[0] + 1);
      }
      unaff_R12 = (ostream *)local_360;
      if (local_370 != unaff_R12) {
        operator_delete(local_370,local_360[0] + 1);
      }
      std::__cxx11::stringbuf::str();
      if (2 < local_368) {
        local_350 = local_370[2];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_350,1);
        if (local_370 != unaff_R12) {
          operator_delete(local_370,local_360[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"e",1);
        std::__cxx11::stringbuf::str();
        std::ostream::_M_insert<unsigned_long>((ulong)local_320);
        if (local_370 != unaff_R12) {
          operator_delete(local_370,local_360[0] + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_330);
        std::ios_base::~ios_base(local_2b0);
        goto LAB_00102b05;
      }
      goto LAB_00102b5b;
    }
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_00102b5b:
  uVar1 = std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",2);
  if (local_370 != unaff_R12) {
    operator_delete(local_370,local_360[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_330);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  _Unwind_Resume(uVar1);
}

Assistant:

string toEnotation(LIndex nr)
{
    stringstream ss;
    ss << nr;
    if(ss.str().size()>3)
    {
        stringstream ssE;
        ssE << ss.str().at(0) << "." << ss.str().at(1);
        ssE << ss.str().at(2);
        ssE << "e" << ss.str().size()-1;
        return(ssE.str());
    } 
    else
        return(ss.str());
}